

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cpp
# Opt level: O1

int rs_restore_file(FILE *inf)

{
  pointer pAVar1;
  uint uVar2;
  byte bVar3;
  int iVar4;
  int *piVar5;
  MonsterThing *pMVar6;
  _List_node_base *p_Var7;
  ItemThing *pIVar8;
  daemon_function_t p_Var9;
  _Self __tmp;
  list<MonsterThing_*,_std::allocator<MonsterThing_*>_> *plVar10;
  ItemThing **item;
  ItemThing **item_00;
  ItemThing **item_01;
  ItemThing **item_02;
  ItemThing **item_03;
  ItemThing **item_04;
  uint uVar11;
  uint y;
  char **master;
  char *pcVar12;
  uint x;
  long lVar13;
  size_type __new_size;
  bool bVar14;
  int value;
  int value_3;
  int value_4;
  uint local_3c;
  uint local_38;
  int local_34;
  
  bVar3 = format_error | read_error;
  if ((bVar3 & 1) == 0) {
    rs_read_boolean(inf,&after);
    rs_read_boolean(inf,&again);
    rs_read_boolean(inf,&seenstairs);
    rs_read_boolean(inf,&amulet);
    rs_read_boolean(inf,&door_stop);
    rs_read_boolean(inf,&fight_flush);
    rs_read_boolean(inf,&firstmove);
    rs_read_boolean(inf,&has_hit);
    rs_read_boolean(inf,&inv_describe);
    rs_read_boolean(inf,&jump);
    rs_read_boolean(inf,&kamikaze);
    rs_read_boolean(inf,&lower_msg);
    rs_read_boolean(inf,&move_on);
    rs_read_boolean(inf,&passgo);
    rs_read_boolean(inf,&playing);
    rs_read_boolean(inf,&running);
    rs_read_boolean(inf,&save_msg);
    rs_read_boolean(inf,&terse);
    rs_read_boolean(inf,&to_death);
    local_3c = 0;
    if ((read_error == 0) && ((format_error & 1) == 0)) {
      rs_read_int(inf,(int *)&local_3c);
      if (local_3c != 0x1a) {
        format_error = 1;
      }
      lVar13 = 0;
      do {
        iVar4 = rs_read_boolean(inf,pack_used + lVar13);
        if (iVar4 != 0) break;
        bVar14 = lVar13 != 0x19;
        lVar13 = lVar13 + 1;
      } while (bVar14);
    }
    rs_read_int(inf,&dir_ch);
    rs_read_chars(inf,file_name,0x400);
    rs_read_chars(inf,huh,0x400);
    if ((read_error == 0) && ((format_error & 1) == 0)) {
      lVar13 = 0;
      do {
        rs_read_string_index(inf,rainbow,cNCOLORS,(char **)((long)p_colors + lVar13));
        lVar13 = lVar13 + 8;
      } while (lVar13 != 0x70);
    }
    rs_read_chars(inf,prbuf,0x800);
    if ((read_error == 0) && ((format_error & 1) == 0)) {
      lVar13 = 0;
      do {
        iVar4 = cNSTONES;
        local_3c = 0;
        if ((read_error == 0) && ((format_error & 1) == 0)) {
          rs_read_int(inf,(int *)&local_3c);
          if (iVar4 < (int)local_3c) {
            format_error = 1;
          }
          else if ((int)local_3c < 0) {
            r_stones[lVar13] = (char *)0x0;
          }
          else {
            r_stones[lVar13] = stones[local_3c].st_name;
          }
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 != 0xe);
    }
    rs_read_int(inf,&runch);
    if ((read_error == 0) && ((format_error & 1) == 0)) {
      lVar13 = 0;
      do {
        rs_read_new_string(inf,(char **)((long)s_names + lVar13));
        lVar13 = lVar13 + 8;
      } while (lVar13 != 0x98);
    }
    rs_read_char(inf,&take);
    local_3c = 0;
    if ((read_error == 0) && ((format_error & 1) == 0)) {
      lVar13 = 0;
      do {
        rs_read_int(inf,(int *)&local_3c);
        bVar14 = local_3c == 0;
        master = metal;
        if (bVar14) {
          master = wood;
        }
        pcVar12 = "wand";
        if (bVar14) {
          pcVar12 = "staff";
        }
        piVar5 = &cNMETAL;
        if (bVar14) {
          piVar5 = &cNWOOD;
        }
        rs_read_string_index(inf,master,*piVar5,(char **)((long)ws_made + lVar13));
        *(char **)((long)ws_type + lVar13) = pcVar12;
        lVar13 = lVar13 + 8;
      } while (lVar13 != 0x70);
    }
    rs_read_int(inf,&l_last_comm);
    rs_read_int(inf,&l_last_dir);
    rs_read_int(inf,&last_comm);
    rs_read_int(inf,&last_dir);
    rs_read_int(inf,&n_objs);
    rs_read_int(inf,&hungry_state);
    rs_read_int(inf,&inv_type);
    rs_read_int(inf,&level);
    rs_read_int(inf,&max_level);
    rs_read_int(inf,&no_food);
    rs_read_ints(inf,a_class,8);
    rs_read_int(inf,&count);
    rs_read_int(inf,&food_left);
    rs_read_int(inf,&lastscore);
    rs_read_int(inf,&no_command);
    rs_read_int(inf,&no_move);
    rs_read_int(inf,&purse);
    rs_read_int(inf,&quiet);
    rs_read_int(inf,&vf_hit);
    rs_read_int(inf,&dnum);
    rs_read_ints(inf,e_levels,0x15);
    rs_read_coord(inf,&delta);
    rs_read_coord(inf,&oldpos);
    rs_read_coord(inf,&stairs);
    rs_read_thing(inf,&player);
    rs_read_object_reference(inf,(list<ItemThing_*,_std::allocator<ItemThing_*>_> *)&cur_armor,item)
    ;
    rs_read_object_reference
              (inf,(list<ItemThing_*,_std::allocator<ItemThing_*>_> *)cur_ring,item_00);
    rs_read_object_reference
              (inf,(list<ItemThing_*,_std::allocator<ItemThing_*>_> *)(cur_ring + 1),item_01);
    rs_read_object_reference
              (inf,(list<ItemThing_*,_std::allocator<ItemThing_*>_> *)&cur_weapon,item_02);
    rs_read_object_reference
              (inf,(list<ItemThing_*,_std::allocator<ItemThing_*>_> *)&l_last_pick,item_03);
    rs_read_object_reference
              (inf,(list<ItemThing_*,_std::allocator<ItemThing_*>_> *)&last_pick,item_04);
    rs_read_object_list(inf,&lvl_obj_abi_cxx11_);
    if ((read_error == 0) && ((format_error & 1) == 0)) {
      rs_read_marker(inf,-0x5432fff7);
      rs_read_int(inf,(int *)&local_3c);
      uVar11 = local_3c;
      if (0 < (int)local_3c) {
        do {
          pMVar6 = (MonsterThing *)operator_new(0x68);
          MonsterThing::MonsterThing(pMVar6);
          p_Var7 = (_List_node_base *)operator_new(0x18);
          p_Var7[1]._M_next = (_List_node_base *)pMVar6;
          std::__detail::_List_node_base::_M_hook(p_Var7,(_List_node_base *)&mlist_abi_cxx11_);
          mlist_abi_cxx11_.super__List_base<MonsterThing_*,_std::allocator<MonsterThing_*>_>._M_impl
          ._M_node._M_size =
               mlist_abi_cxx11_.super__List_base<MonsterThing_*,_std::allocator<MonsterThing_*>_>.
               _M_impl._M_node._M_size + 1;
          rs_read_thing(inf,pMVar6);
          uVar11 = uVar11 - 1;
        } while (uVar11 != 0);
      }
    }
    p_Var7 = mlist_abi_cxx11_.super__List_base<MonsterThing_*,_std::allocator<MonsterThing_*>_>.
             _M_impl._M_node.super__List_node_base._M_next;
    if (-1 < player.reserved) {
      iVar4 = player.reserved + 1;
      plVar10 = &mlist_abi_cxx11_;
      do {
        plVar10 = (list<MonsterThing_*,_std::allocator<MonsterThing_*>_> *)
                  (((_List_base<MonsterThing_*,_std::allocator<MonsterThing_*>_> *)
                   &((_List_node_base *)plVar10)->_M_next)->_M_impl)._M_node.super__List_node_base.
                  _M_next;
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
      if (*(coord **)((long)plVar10 + 0x10) != (coord *)0x0) {
        player.dest = *(coord **)((long)plVar10 + 0x10);
      }
    }
    for (; p_Var7 != (_List_node_base *)&mlist_abi_cxx11_;
        p_Var7 = (((_List_base<MonsterThing_*,_std::allocator<MonsterThing_*>_> *)&p_Var7->_M_next)
                 ->_M_impl)._M_node.super__List_node_base._M_next) {
      iVar4 = *(int *)&p_Var7[1]._M_next[6]._M_next;
      if (-1 < iVar4) {
        iVar4 = iVar4 + 1;
        plVar10 = &mlist_abi_cxx11_;
        do {
          plVar10 = (list<MonsterThing_*,_std::allocator<MonsterThing_*>_> *)
                    (((_List_base<MonsterThing_*,_std::allocator<MonsterThing_*>_> *)
                     &((_List_node_base *)plVar10)->_M_next)->_M_impl)._M_node.super__List_node_base
                    ._M_next;
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
        if (*(_List_node_base **)((long)plVar10 + 0x10) != (_List_node_base *)0x0) {
          p_Var7[1]._M_next[1]._M_next = *(_List_node_base **)((long)plVar10 + 0x10);
        }
      }
    }
    if ((read_error == 0) && ((format_error & 1) == 0)) {
      lVar13 = 0;
      do {
        rs_read_char(inf,&places[lVar13].p_ch);
        rs_read_int(inf,&places[lVar13].p_flags);
        if ((read_error == 0) && ((format_error & 1) == 0)) {
          rs_read_int(inf,(int *)&local_3c);
          if (local_3c == 0xffffffff) {
            pMVar6 = (MonsterThing *)0x0;
          }
          else {
            p_Var7 = mlist_abi_cxx11_.
                     super__List_base<MonsterThing_*,_std::allocator<MonsterThing_*>_>._M_impl.
                     _M_node.super__List_node_base._M_next;
            if (0 < (int)local_3c) {
              iVar4 = local_3c + 1;
              do {
                p_Var7 = p_Var7->_M_next;
                iVar4 = iVar4 + -1;
              } while (1 < iVar4);
              local_3c = 0;
            }
            pMVar6 = (MonsterThing *)p_Var7[1]._M_next;
          }
          places[lVar13].p_monst = pMVar6;
        }
        if ((read_error == 0) && ((format_error & 1) == 0)) {
          rs_read_int(inf,(int *)&local_3c);
          if (local_3c == 0xffffffff) {
            pIVar8 = (ItemThing *)0x0;
          }
          else {
            p_Var7 = lvl_obj_abi_cxx11_.super__List_base<ItemThing_*,_std::allocator<ItemThing_*>_>.
                     _M_impl._M_node.super__List_node_base._M_next;
            if (0 < (int)local_3c) {
              iVar4 = local_3c + 1;
              do {
                p_Var7 = p_Var7->_M_next;
                iVar4 = iVar4 + -1;
              } while (1 < iVar4);
              local_3c = 0;
            }
            pIVar8 = (ItemThing *)p_Var7[1]._M_next;
          }
          places[lVar13].p_item = pIVar8;
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 != 0xa00);
    }
    rs_read_stats(inf,&max_stats);
    local_3c = 0;
    if ((read_error == 0) && ((format_error & 1) == 0)) {
      rs_read_int(inf,(int *)&local_3c);
      uVar11 = local_3c;
      __new_size = (size_type)(int)local_3c;
      if ((long)__new_size < 0) {
        format_error = 1;
      }
      std::vector<Area,_std::allocator<Area>_>::resize(&areas,__new_size);
      if (0 < (int)uVar11) {
        lVar13 = 0;
        do {
          pAVar1 = areas.super__Vector_base<Area,_std::allocator<Area>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((read_error == 0) && ((format_error & 1) == 0)) {
            rs_read_coord(inf,(coord *)((long)&((areas.
                                                 super__Vector_base<Area,_std::allocator<Area>_>.
                                                 _M_impl.super__Vector_impl_data._M_start)->position
                                               ).x + lVar13));
            rs_read_coord(inf,(coord *)((long)&(pAVar1->size).x + lVar13));
            rs_read_int(inf,(int *)((long)&pAVar1->flags + lVar13));
          }
          lVar13 = lVar13 + 0x14;
        } while (__new_size * 0x14 != lVar13);
      }
    }
    local_3c = 0;
    if ((read_error == 0) && ((format_error & 1) == 0)) {
      rs_read_marker(inf,-0x5432fff5);
      rs_read_int(inf,(int *)&local_3c);
      if (local_3c != 0x1a) {
        format_error = 1;
      }
      lVar13 = 0x10;
      do {
        rs_read_stats(inf,(stats *)(monsters[0].m_stats.s_dmg + lVar13 + -0x24));
        lVar13 = lVar13 + 0x38;
      } while (lVar13 != 0x5c0);
    }
    rs_read_obj_info(inf,things,7);
    rs_read_obj_info(inf,food_info,7);
    rs_read_obj_info(inf,arm_info,8);
    rs_read_obj_info(inf,pot_info,0xe);
    rs_read_obj_info(inf,ring_info,0xe);
    rs_read_obj_info(inf,scr_info,0x13);
    rs_read_obj_info(inf,weap_info,10);
    rs_read_obj_info(inf,ws_info,0xe);
    local_3c = 0;
    local_38 = 0;
    if ((read_error == 0) && ((format_error & 1) == 0)) {
      rs_read_marker(inf,-0x5432fff2);
      rs_read_int(inf,(int *)&local_38);
      if (0x14 < (int)local_38) {
        format_error = 1;
      }
      piVar5 = &d_list[0].d_arg;
      lVar13 = 0x14;
      do {
        local_3c = 0;
        rs_read_int(inf,(int *)(piVar5 + -4));
        rs_read_int(inf,(int *)&local_3c);
        rs_read_int(inf,piVar5);
        rs_read_int(inf,piVar5 + 1);
        if (local_3c - 1 < 9) {
          p_Var9 = (daemon_function_t)(&PTR_rollwand_0015abc0)[local_3c - 1];
        }
        else {
          p_Var9 = (daemon_function_t)0x0;
        }
        *(daemon_function_t *)(piVar5 + -2) = p_Var9;
        piVar5 = piVar5 + 6;
        lVar13 = lVar13 + -1;
      } while (lVar13 != 0);
      if (prname::tbuf._8_8_ == 0) {
        prname::tbuf[0] = '\0';
        prname::tbuf[1] = '\0';
        prname::tbuf[2] = '\0';
        prname::tbuf[3] = '\0';
        prname::tbuf[0x10] = '\0';
        prname::tbuf[0x11] = '\0';
        prname::tbuf[0x12] = '\0';
        prname::tbuf[0x13] = '\0';
        prname::tbuf[0x14] = '\0';
        prname::tbuf[0x15] = '\0';
        prname::tbuf[0x16] = '\0';
        prname::tbuf[0x17] = '\0';
      }
    }
    rs_read_int(inf,&between);
    rs_read_int(inf,&group);
    if ((read_error == 0) && ((format_error & 1) == 0)) {
      rs_read_marker(inf,-0x5432fff3);
      rs_read_int(inf,(int *)&local_3c);
      rs_read_int(inf,(int *)&local_38);
      uVar2 = local_38;
      uVar11 = local_3c;
      if (0 < (int)local_3c) {
        y = 0;
        do {
          if (0 < (int)uVar2) {
            x = 0;
            do {
              iVar4 = rs_read_int(inf,&local_34);
              if (iVar4 != 0) goto LAB_0012332d;
              if (x < 0x50 && y < 0x20) {
                setMapDisplay(x,y,local_34);
              }
              x = x + 1;
            } while (uVar2 != x);
          }
          y = y + 1;
        } while (y != uVar11);
      }
    }
LAB_0012332d:
    bVar3 = read_error | format_error;
  }
  return bVar3 & 1;
}

Assistant:

int rs_restore_file(FILE *inf)
{
    if (read_error || format_error)
        return(READSTAT);

    rs_read_boolean(inf, &after);               /* 1  */    /* extern.c */
    rs_read_boolean(inf, &again);               /* 2  */
    rs_read_boolean(inf, &seenstairs);          /* 4  */
    rs_read_boolean(inf, &amulet);              /* 5  */
    rs_read_boolean(inf, &door_stop);           /* 6  */
    rs_read_boolean(inf, &fight_flush);         /* 7  */
    rs_read_boolean(inf, &firstmove);           /* 8  */
    rs_read_boolean(inf, &has_hit);             /* 10 */
    rs_read_boolean(inf, &inv_describe);        /* 12 */
    rs_read_boolean(inf, &jump);                /* 13 */
    rs_read_boolean(inf, &kamikaze);            /* 14 */
    rs_read_boolean(inf, &lower_msg);           /* 15 */
    rs_read_boolean(inf, &move_on);             /* 16 */
    rs_read_boolean(inf, &passgo);              /* 18 */
    rs_read_boolean(inf, &playing);             /* 19 */
    rs_read_boolean(inf, &running);             /* 21 */
    rs_read_boolean(inf, &save_msg);            /* 22 */
    rs_read_boolean(inf, &terse);               /* 25 */
    rs_read_boolean(inf, &to_death);            /* 26 */
    rs_read_booleans(inf, pack_used, 26);       /* 29 */
    rs_read_int(inf, &dir_ch);
    rs_read_chars(inf, file_name, MAXSTR);
    rs_read_chars(inf, huh, MAXSTR);
    rs_read_potions(inf);
    rs_read_chars(inf, prbuf, 2*MAXSTR);
    rs_read_rings(inf);
    rs_read_int(inf, &runch);
    rs_read_scrolls(inf);
    rs_read_char(inf, &take);
    rs_read_sticks(inf);
    rs_read_int(inf, &l_last_comm);
    rs_read_int(inf, &l_last_dir);
    rs_read_int(inf, &last_comm);
    rs_read_int(inf, &last_dir);
    rs_read_int(inf, &n_objs);
    rs_read_int(inf, &hungry_state);
    rs_read_int(inf, &inv_type);
    rs_read_int(inf, &level);
    rs_read_int(inf, &max_level);
    rs_read_int(inf, &no_food);
    rs_read_ints(inf,a_class,MAXARMORS);
    rs_read_int(inf, &count);
    rs_read_int(inf, &food_left);
    rs_read_int(inf, &lastscore);
    rs_read_int(inf, &no_command);
    rs_read_int(inf, &no_move);
    rs_read_int(inf, &purse);
    rs_read_int(inf, &quiet);
    rs_read_int(inf, &vf_hit);
    rs_read_int(inf, &dnum);
    rs_read_ints(inf,e_levels,21);
    rs_read_coord(inf, &delta);
    rs_read_coord(inf, &oldpos);
    rs_read_coord(inf, &stairs);

    rs_read_thing(inf, &player); 
    rs_read_object_reference(inf, player.pack, &cur_armor);
    rs_read_object_reference(inf, player.pack, &cur_ring[0]);
    rs_read_object_reference(inf, player.pack, &cur_ring[1]);
    rs_read_object_reference(inf, player.pack, &cur_weapon);
    rs_read_object_reference(inf, player.pack, &l_last_pick);
    rs_read_object_reference(inf, player.pack, &last_pick);

    rs_read_object_list(inf, lvl_obj);
    rs_read_monster_list(inf);                  
    rs_fix_monster(&player);
    rs_fix_monster_list();

    rs_read_places(inf,places,MAXLINES*MAXCOLS);

    rs_read_stats(inf, &max_stats);
    rs_read_areas(inf);

    rs_read_monsters(inf,monsters,26);                  
    rs_read_obj_info(inf, things,   NUMITEMTYPES);         
    rs_read_obj_info(inf, food_info, MAXFOODS);  
    rs_read_obj_info(inf, arm_info,  MAXARMORS);         
    rs_read_obj_info(inf, pot_info,  MAXPOTIONS);       
    rs_read_obj_info(inf, ring_info, MAXRINGS);         
    rs_read_obj_info(inf, scr_info,  MAXSCROLLS);       
    rs_read_obj_info(inf, weap_info, MAXWEAPONS+1);       
    rs_read_obj_info(inf, ws_info,   MAXSTICKS);       

    rs_read_daemons(inf, d_list, 20);                   /* 5.4-daemon.c     */
    rs_read_int(inf,&between);                          /* 5.4-daemons.c    */
    rs_read_int(inf,&group);                            /* 5.4-weapons.c    */
    
    rs_read_window(inf);

    return(READSTAT);
}